

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-md5.c
# Opt level: O2

void pp_crypto_hash_md5_process(PHashMD5 *ctx,puint32 *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  puint32 pVar4;
  puint32 pVar5;
  puint32 pVar6;
  puint32 pVar7;
  puint32 pVar8;
  puint32 pVar9;
  puint32 pVar10;
  puint32 pVar11;
  puint32 pVar12;
  puint32 pVar13;
  puint32 pVar14;
  puint32 pVar15;
  puint32 pVar16;
  puint32 pVar17;
  puint32 pVar18;
  puint32 pVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  
  uVar1 = ctx->hash[1];
  uVar2 = ctx->hash[2];
  uVar3 = ctx->hash[3];
  pVar4 = *data;
  pVar5 = data[1];
  uVar20 = ((uVar3 ^ uVar2) & uVar1 ^ uVar3) + ctx->hash[0] + pVar4 + 0xd76aa478;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar1;
  uVar21 = ((uVar2 ^ uVar1) & uVar20 ^ uVar2) + uVar3 + pVar5 + 0xe8c7b756;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  pVar6 = data[2];
  uVar22 = ((uVar20 ^ uVar1) & uVar21 ^ uVar1) + pVar6 + uVar2 + 0x242070db;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  pVar7 = data[3];
  uVar24 = uVar1 + pVar7 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0xc1bdceee;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar22;
  pVar8 = data[4];
  uVar20 = uVar20 + pVar8 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0xf57c0faf;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  pVar9 = data[5];
  uVar21 = uVar21 + pVar9 + ((uVar24 ^ uVar22) & uVar20 ^ uVar22) + 0x4787c62a;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  pVar10 = data[6];
  uVar22 = uVar22 + pVar10 + ((uVar20 ^ uVar24) & uVar21 ^ uVar24) + 0xa8304613;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  pVar11 = data[7];
  uVar24 = uVar24 + pVar11 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0xfd469501;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar22;
  pVar12 = data[8];
  uVar20 = uVar20 + pVar12 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0x698098d8;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  pVar13 = data[9];
  uVar21 = uVar21 + pVar13 + ((uVar24 ^ uVar22) & uVar20 ^ uVar22) + 0x8b44f7af;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  pVar14 = data[10];
  uVar22 = (uVar22 + pVar14 + ((uVar20 ^ uVar24) & uVar21 ^ uVar24)) - 0xa44f;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  pVar15 = data[0xb];
  uVar24 = ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + uVar24 + pVar15 + 0x895cd7be;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar22;
  pVar16 = data[0xc];
  uVar20 = uVar20 + pVar16 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0x6b901122;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  pVar17 = data[0xd];
  uVar21 = ((uVar24 ^ uVar22) & uVar20 ^ uVar22) + uVar21 + pVar17 + 0xfd987193;
  uVar23 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  pVar18 = data[0xe];
  uVar21 = uVar22 + pVar18 + ((uVar20 ^ uVar24) & uVar23 ^ uVar24) + 0xa679438e;
  uVar22 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar23;
  pVar19 = data[0xf];
  uVar21 = uVar24 + pVar19 + ((uVar23 ^ uVar20) & uVar22 ^ uVar20) + 0x49b40821;
  uVar24 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar22;
  uVar20 = uVar20 + pVar5 + ((uVar24 ^ uVar22) & uVar23 ^ uVar22) + 0xf61e2562;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + uVar23 + pVar10 + 0xc040b340;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + pVar15 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0x265e5a51;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + pVar4 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0xe9b6c7aa;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = uVar20 + pVar9 + ((uVar24 ^ uVar22) & uVar21 ^ uVar22) + 0xd62f105d;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = uVar21 + pVar14 + ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + 0x2441453;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + pVar19 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0xd8a1e681;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + pVar8 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0xe7d3fbc8;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = uVar20 + pVar13 + ((uVar24 ^ uVar22) & uVar21 ^ uVar22) + 0x21e1cde6;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = uVar21 + pVar18 + ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + 0xc33707d6;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + pVar7 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0xf4d50d87;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + pVar12 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0x455a14ed;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = uVar20 + pVar17 + ((uVar24 ^ uVar22) & uVar21 ^ uVar22) + 0xa9e3e905;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = uVar21 + pVar6 + ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + 0xfcefa3f8;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + pVar11 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0x676f02d9;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + pVar16 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0x8d2a4c8a;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = (uVar20 + pVar9 + (uVar22 ^ uVar21 ^ uVar24)) - 0x5c6be;
  uVar20 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar21 = uVar21 + pVar12 + (uVar24 ^ uVar22 ^ uVar20) + 0x8771f681;
  uVar21 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar20;
  uVar22 = uVar22 + pVar15 + (uVar20 ^ uVar24 ^ uVar21) + 0x6d9d6122;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar21;
  uVar24 = uVar24 + pVar18 + (uVar21 ^ uVar20 ^ uVar22) + 0xfde5380c;
  uVar24 = (uVar24 * 0x800000 | uVar24 >> 9) + uVar22;
  uVar20 = uVar20 + pVar5 + (uVar22 ^ uVar21 ^ uVar24) + 0xa4beea44;
  uVar20 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar21 = uVar21 + pVar8 + (uVar24 ^ uVar22 ^ uVar20) + 0x4bdecfa9;
  uVar21 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar20;
  uVar22 = uVar22 + pVar11 + (uVar20 ^ uVar24 ^ uVar21) + 0xf6bb4b60;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar21;
  uVar24 = uVar24 + pVar14 + (uVar21 ^ uVar20 ^ uVar22) + 0xbebfbc70;
  uVar24 = (uVar24 * 0x800000 | uVar24 >> 9) + uVar22;
  uVar20 = uVar20 + pVar17 + (uVar22 ^ uVar21 ^ uVar24) + 0x289b7ec6;
  uVar20 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar21 = uVar21 + pVar4 + (uVar24 ^ uVar22 ^ uVar20) + 0xeaa127fa;
  uVar21 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar20;
  uVar22 = uVar22 + pVar7 + (uVar20 ^ uVar24 ^ uVar21) + 0xd4ef3085;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar21;
  uVar24 = (uVar21 ^ uVar20 ^ uVar22) + uVar24 + pVar10 + 0x4881d05;
  uVar23 = (uVar24 * 0x800000 | uVar24 >> 9) + uVar22;
  uVar20 = (uVar22 ^ uVar21 ^ uVar23) + uVar20 + pVar13 + 0xd9d4d039;
  uVar24 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar23;
  uVar20 = (uVar23 ^ uVar22 ^ uVar24) + uVar21 + pVar16 + 0xe6db99e5;
  uVar20 = (uVar20 * 0x800 | uVar20 >> 0x15) + uVar24;
  uVar21 = (uVar24 ^ uVar23 ^ uVar20) + uVar22 + pVar19 + 0x1fa27cf8;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar20;
  uVar22 = (uVar20 ^ uVar24 ^ uVar21) + uVar23 + pVar6 + 0xc4ac5665;
  uVar22 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar21;
  uVar24 = ((~uVar20 | uVar22) ^ uVar21) + uVar24 + pVar4 + 0xf4292244;
  uVar24 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar22;
  uVar20 = ((~uVar21 | uVar24) ^ uVar22) + uVar20 + pVar11 + 0x432aff97;
  uVar23 = (uVar20 * 0x400 | uVar20 >> 0x16) + uVar24;
  uVar20 = uVar21 + pVar18 + ((~uVar22 | uVar23) ^ uVar24) + 0xab9423a7;
  uVar21 = (uVar20 * 0x8000 | uVar20 >> 0x11) + uVar23;
  uVar20 = ((~uVar24 | uVar21) ^ uVar23) + uVar22 + pVar9 + 0xfc93a039;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar22 = ((~uVar23 | uVar20) ^ uVar21) + uVar24 + pVar16 + 0x655b59c3;
  uVar22 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar20;
  uVar24 = uVar23 + pVar7 + ((~uVar21 | uVar22) ^ uVar20) + 0x8f0ccc92;
  uVar23 = (uVar24 * 0x400 | uVar24 >> 0x16) + uVar22;
  uVar21 = (uVar21 + pVar14 + ((~uVar20 | uVar23) ^ uVar22)) - 0x100b83;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar23;
  uVar20 = uVar20 + pVar5 + ((~uVar22 | uVar21) ^ uVar23) + 0x85845dd1;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar22 = uVar22 + pVar12 + ((~uVar23 | uVar20) ^ uVar21) + 0x6fa87e4f;
  uVar24 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar20;
  uVar22 = ((~uVar21 | uVar24) ^ uVar20) + uVar23 + pVar19 + 0xfe2ce6e0;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar24;
  uVar21 = uVar21 + pVar10 + ((~uVar20 | uVar22) ^ uVar24) + 0xa3014314;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar22;
  uVar20 = uVar20 + pVar17 + ((~uVar24 | uVar21) ^ uVar22) + 0x4e0811a1;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar24 = ((~uVar22 | uVar20) ^ uVar21) + uVar24 + pVar8 + 0xf7537e82;
  uVar24 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar20;
  uVar22 = uVar22 + pVar15 + ((~uVar21 | uVar24) ^ uVar20) + 0xbd3af235;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar24;
  uVar21 = uVar21 + pVar6 + ((~uVar20 | uVar22) ^ uVar24) + 0x2ad7d2bb;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar22;
  uVar20 = uVar20 + pVar13 + ((~uVar24 | uVar21) ^ uVar22) + 0xeb86d391;
  ctx->hash[0] = uVar24 + ctx->hash[0];
  ctx->hash[1] = uVar1 + uVar21 + (uVar20 * 0x200000 | uVar20 >> 0xb);
  ctx->hash[2] = uVar21 + uVar2;
  ctx->hash[3] = uVar22 + uVar3;
  return;
}

Assistant:

static void
pp_crypto_hash_md5_process (PHashMD5		*ctx,
			    const puint32	data[16])
{
	puint32	A;
	puint32	B;
	puint32	C;
	puint32	D;

	A = ctx->hash[0];
	B = ctx->hash[1];
	C = ctx->hash[2];
	D = ctx->hash[3];

	P_MD5_ROUND_0 (A, B, C, D, 0,  0xD76AA478,  7);
	P_MD5_ROUND_0 (D, A, B, C, 1,  0xE8C7B756, 12);
	P_MD5_ROUND_0 (C, D, A, B, 2,  0x242070DB, 17);
	P_MD5_ROUND_0 (B, C, D, A, 3,  0xC1BDCEEE, 22);
	P_MD5_ROUND_0 (A, B, C, D, 4,  0xF57C0FAF,  7);
	P_MD5_ROUND_0 (D, A, B, C, 5,  0x4787C62A, 12);
	P_MD5_ROUND_0 (C, D, A, B, 6,  0xA8304613, 17);
	P_MD5_ROUND_0 (B, C, D, A, 7,  0xFD469501, 22);
	P_MD5_ROUND_0 (A, B, C, D, 8,  0x698098D8,  7);
	P_MD5_ROUND_0 (D, A, B, C, 9,  0x8B44F7AF, 12);
	P_MD5_ROUND_0 (C, D, A, B, 10, 0xFFFF5BB1, 17);
	P_MD5_ROUND_0 (B, C, D, A, 11, 0x895CD7BE, 22);
	P_MD5_ROUND_0 (A, B, C, D, 12, 0x6B901122,  7);
	P_MD5_ROUND_0 (D, A, B, C, 13, 0xFD987193, 12);
	P_MD5_ROUND_0 (C, D, A, B, 14, 0xA679438E, 17);
	P_MD5_ROUND_0 (B, C, D, A, 15, 0x49B40821, 22);

	P_MD5_ROUND_1 (A, B, C, D, 1,  0xF61E2562,  5);
	P_MD5_ROUND_1 (D, A, B, C, 6,  0xC040B340,  9);
	P_MD5_ROUND_1 (C, D, A, B, 11, 0x265E5A51, 14);
	P_MD5_ROUND_1 (B, C, D, A, 0,  0xE9B6C7AA, 20);
	P_MD5_ROUND_1 (A, B, C, D, 5,  0xD62F105D,  5);
	P_MD5_ROUND_1 (D, A, B, C, 10, 0x02441453,  9);
	P_MD5_ROUND_1 (C, D, A, B, 15, 0xD8A1E681, 14);
	P_MD5_ROUND_1 (B, C, D, A, 4,  0xE7D3FBC8, 20);
	P_MD5_ROUND_1 (A, B, C, D, 9,  0x21E1CDE6,  5);
	P_MD5_ROUND_1 (D, A, B, C, 14, 0xC33707D6,  9);
	P_MD5_ROUND_1 (C, D, A, B, 3,  0xF4D50D87, 14);
	P_MD5_ROUND_1 (B, C, D, A, 8,  0x455A14ED, 20);
	P_MD5_ROUND_1 (A, B, C, D, 13, 0xA9E3E905,  5);
	P_MD5_ROUND_1 (D, A, B, C, 2,  0xFCEFA3F8,  9);
	P_MD5_ROUND_1 (C, D, A, B, 7,  0x676F02D9, 14);
	P_MD5_ROUND_1 (B, C, D, A, 12, 0x8D2A4C8A, 20);

	P_MD5_ROUND_2 (A, B, C, D, 5,  0xFFFA3942,  4);
	P_MD5_ROUND_2 (D, A, B, C, 8,  0x8771F681, 11);
	P_MD5_ROUND_2 (C, D, A, B, 11, 0x6D9D6122, 16);
	P_MD5_ROUND_2 (B, C, D, A, 14, 0xFDE5380C, 23);
	P_MD5_ROUND_2 (A, B, C, D, 1,  0xA4BEEA44,  4);
	P_MD5_ROUND_2 (D, A, B, C, 4,  0x4BDECFA9, 11);
	P_MD5_ROUND_2 (C, D, A, B, 7,  0xF6BB4B60, 16);
	P_MD5_ROUND_2 (B, C, D, A, 10, 0xBEBFBC70, 23);
	P_MD5_ROUND_2 (A, B, C, D, 13, 0x289B7EC6,  4);
	P_MD5_ROUND_2 (D, A, B, C, 0,  0xEAA127FA, 11);
	P_MD5_ROUND_2 (C, D, A, B, 3,  0xD4EF3085, 16);
	P_MD5_ROUND_2 (B, C, D, A, 6,  0x04881D05, 23);
	P_MD5_ROUND_2 (A, B, C, D, 9,  0xD9D4D039,  4);
	P_MD5_ROUND_2 (D, A, B, C, 12, 0xE6DB99E5, 11);
	P_MD5_ROUND_2 (C, D, A, B, 15, 0x1FA27CF8, 16);
	P_MD5_ROUND_2 (B, C, D, A, 2,  0xC4AC5665, 23);

	P_MD5_ROUND_3 (A, B, C, D, 0,  0xF4292244,  6);
	P_MD5_ROUND_3 (D, A, B, C, 7,  0x432AFF97, 10);
	P_MD5_ROUND_3 (C, D, A, B, 14, 0xAB9423A7, 15);
	P_MD5_ROUND_3 (B, C, D, A, 5,  0xFC93A039, 21);
	P_MD5_ROUND_3 (A, B, C, D, 12, 0x655B59C3,  6);
	P_MD5_ROUND_3 (D, A, B, C, 3,  0x8F0CCC92, 10);
	P_MD5_ROUND_3 (C, D, A, B, 10, 0xFFEFF47D, 15);
	P_MD5_ROUND_3 (B, C, D, A, 1,  0x85845DD1, 21);
	P_MD5_ROUND_3 (A, B, C, D, 8,  0x6FA87E4F,  6);
	P_MD5_ROUND_3 (D, A, B, C, 15, 0xFE2CE6E0, 10);
	P_MD5_ROUND_3 (C, D, A, B, 6,  0xA3014314, 15);
	P_MD5_ROUND_3 (B, C, D, A, 13, 0x4E0811A1, 21);
	P_MD5_ROUND_3 (A, B, C, D, 4,  0xF7537E82,  6);
	P_MD5_ROUND_3 (D, A, B, C, 11, 0xBD3AF235, 10);
	P_MD5_ROUND_3 (C, D, A, B, 2,  0x2AD7D2BB, 15);
	P_MD5_ROUND_3 (B, C, D, A, 9,  0xEB86D391, 21);

	ctx->hash[0] += A;
	ctx->hash[1] += B;
	ctx->hash[2] += C;
	ctx->hash[3] += D;
}